

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O0

void __thiscall glcts::GeometryShaderAdjacency::initTest(GeometryShaderAdjacency *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  char **local_a0;
  GLuint local_8c;
  char *local_70;
  char *varyings_1 [1];
  char *varyings [2];
  char *local_50;
  char *vsCode;
  char *gsCode;
  char *fsCode;
  long local_28;
  Functions *gl;
  GeometryShaderAdjacency *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar2);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
               ,0x110);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(local_28 + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x114);
  gsCode = getFragmentShaderCode(this);
  vsCode = this->m_test_data->m_gs_code;
  local_50 = getVertexShaderCode(this);
  GVar4 = (**(code **)(local_28 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(local_28 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  GVar4 = (**(code **)(local_28 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_gs_id = GVar4;
  GVar4 = (**(code **)(local_28 + 0x3c8))();
  this->m_po_id = GVar4;
  dVar3 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar3,"Error creating program/shader objects.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x121);
  if (this->m_test_data->m_gs_code == (char *)0x0) {
    local_70 = "gl_Position";
    (**(code **)(local_28 + 0x14c8))(this->m_po_id,1,&local_70,0x8c8d);
  }
  else {
    varyings_1[0] = "out_adjacent_geometry";
    (**(code **)(local_28 + 0x14c8))(this->m_po_id,2,varyings_1,0x8c8d);
  }
  dVar3 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar3,"Error configuring vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x130);
  if (vsCode == (char *)0x0) {
    local_8c = 0;
  }
  else {
    local_8c = this->m_gs_id;
  }
  if (vsCode == (char *)0x0) {
    local_a0 = (char **)0x0;
  }
  else {
    local_a0 = &vsCode;
  }
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&gsCode,local_8c,
                     (uint)(vsCode != (char *)0x0),local_a0,this->m_vs_id,1,&local_50,(bool *)0x0);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Could not create a program object from a valid shader!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
               ,0x136);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(local_28 + 0x6c8))(1,&this->m_vertex_data_bo_id);
  (**(code **)(local_28 + 0x6c8))(1,&this->m_adjacency_geometry_bo_id);
  (**(code **)(local_28 + 0x6c8))(1,&this->m_geometry_bo_id);
  (**(code **)(local_28 + 0x40))(0x8892,this->m_adjacency_geometry_bo_id);
  (**(code **)(local_28 + 0x150))(0x8892,this->m_test_data->m_geometry_bo_size << 2,0,0x88e8);
  (**(code **)(local_28 + 0x40))(0x8892,this->m_geometry_bo_id);
  (**(code **)(local_28 + 0x150))(0x8892,this->m_test_data->m_geometry_bo_size << 2,0,0x88e8);
  (**(code **)(local_28 + 0x40))(0x8892,this->m_vertex_data_bo_id);
  (**(code **)(local_28 + 0x150))
            (0x8892,this->m_test_data->m_vertex_data_bo_size,this->m_test_data->m_vertex_data,0x88e8
            );
  (**(code **)(local_28 + 0x40))(0x8892,0);
  dVar3 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar3,"Error configuring vertex buffer objects for vertex data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x147);
  if (this->m_test_data->m_index_data_bo_size != 0) {
    (**(code **)(local_28 + 0x6c8))(1,&this->m_index_data_bo_id);
    (**(code **)(local_28 + 0x40))(0x8893,this->m_index_data_bo_id);
    (**(code **)(local_28 + 0x150))
              (0x8893,this->m_test_data->m_index_data_bo_size,this->m_test_data->m_index_data,0x88e8
              );
    (**(code **)(local_28 + 0x40))(0x8893,0);
    dVar3 = (**(code **)(local_28 + 0x800))();
    glu::checkError(dVar3,"Error configuring vertex buffer objects for index data!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                    ,0x152);
  }
  return;
}

Assistant:

void GeometryShaderAdjacency::initTest(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* check if EXT_geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	/* Get shader code */
	const char* fsCode = getFragmentShaderCode();
	const char* gsCode = m_test_data.m_gs_code;
	const char* vsCode = getVertexShaderCode();

	/* Create shader and program objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program/shader objects.");

	/* If gs code is available set gs out data for transformfeedback*/
	if (m_test_data.m_gs_code)
	{
		const char* varyings[] = { "out_adjacent_geometry", "out_geometry" };

		gl.transformFeedbackVaryings(m_po_id, 2, varyings, GL_SEPARATE_ATTRIBS);
	}
	else
	{
		const char* varyings[] = { "gl_Position" };

		gl.transformFeedbackVaryings(m_po_id, 1, varyings, GL_SEPARATE_ATTRIBS);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex array object!");

	/* Build program */
	if (!buildProgram(m_po_id, m_fs_id, 1, /* parts */ &fsCode, (gsCode) ? m_gs_id : 0, (gsCode) ? 1 : 0,
					  (gsCode) ? &gsCode : 0, m_vs_id, 1, /* parts */ &vsCode))
	{
		TCU_FAIL("Could not create a program object from a valid shader!");
	}

	/* Generate buffers for input/output vertex data */
	gl.genBuffers(1, &m_vertex_data_bo_id);
	gl.genBuffers(1, &m_adjacency_geometry_bo_id);
	gl.genBuffers(1, &m_geometry_bo_id);

	/* Configure buffers for input/output vertex data */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_adjacency_geometry_bo_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_test_data.m_geometry_bo_size * 4, 0, GL_DYNAMIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_geometry_bo_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_test_data.m_geometry_bo_size * 4, 0, GL_DYNAMIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_data_bo_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_test_data.m_vertex_data_bo_size, m_test_data.m_vertex_data, GL_DYNAMIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex buffer objects for vertex data!");

	/* Configure buffer for index data */
	if (m_test_data.m_index_data_bo_size > 0)
	{
		gl.genBuffers(1, &m_index_data_bo_id);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_data_bo_id);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, m_test_data.m_index_data_bo_size, m_test_data.m_index_data,
					  GL_DYNAMIC_DRAW);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex buffer objects for index data!");
	}
}